

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::set_target
          (MeanSquaredErrorLossLayer *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  undefined1 local_50 [56];
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/../src/../build/format/NeuralNetwork.pb.h"
               ,0xa558);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,value,(allocator<char> *)&local_51);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

inline void MeanSquaredErrorLossLayer::set_target(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  target_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.MeanSquaredErrorLossLayer.target)
}